

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

bool __thiscall Map::Load(Map *this)

{
  short sVar1;
  World *pWVar2;
  byte bVar3;
  bool bVar4;
  byte bVar5;
  short sVar6;
  int iVar7;
  uint uVar8;
  EffectType EVar9;
  uint uVar10;
  uint uVar11;
  TileSpec TVar12;
  uint uVar13;
  mapped_type *pmVar14;
  char *__filename;
  size_t sVar15;
  Map_Tile *pMVar16;
  ENF_Data *this_00;
  undefined8 uVar17;
  NPC *this_01;
  EIF_Data *pEVar18;
  reference psVar19;
  element_type *peVar20;
  int *piVar21;
  long lVar22;
  uchar index_00;
  int local_1ec;
  undefined1 local_1e8 [8];
  Map_Chest_Spawn spawn;
  shared_ptr<Map_Chest> chest_1;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_> *__range2;
  int amount_1;
  short time;
  short itemid;
  short slot;
  uchar y_1;
  uchar x_1;
  int i_3;
  NPC *newnpc;
  int ii_2;
  short local_17c;
  byte local_17a;
  uchar amount;
  short spawntime;
  uchar spawntype;
  short npc_id;
  uchar y;
  uchar x;
  int i_2;
  int index;
  uchar uStack_168;
  undefined3 uStack_167;
  uchar xloc_1;
  Map_Warp newwarp;
  int ii_1;
  undefined1 local_150 [3];
  uchar yloc_1;
  int i_1;
  allocator<char> local_139;
  key_type local_138;
  allocator<char> local_111;
  key_type local_110;
  undefined1 local_f0 [8];
  Map_Chest chest;
  int local_a0;
  uchar spec;
  uchar xloc;
  int ii;
  uchar yloc;
  int i;
  uchar local_8c;
  uchar local_8b;
  uchar innersize;
  uchar outersize;
  char buf [12];
  FILE *fh;
  allocator<char> local_61;
  key_type local_60;
  undefined1 local_40 [8];
  string filename;
  char namebuf [6];
  Map *this_local;
  
  if (this->id < 0) {
    this_local._7_1_ = 0;
  }
  else {
    pWVar2 = this->world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"MapDir",&local_61);
    pmVar14 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
              ::operator[](&(pWVar2->config).
                            super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                           ,&local_60);
    util::variant::operator_cast_to_string((string *)local_40,pmVar14);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    sprintf(filename.field_2._M_local_buf + 10,"%05i",(ulong)(uint)(int)this->id);
    std::__cxx11::string::append(local_40);
    std::__cxx11::string::append(local_40);
    map_safe_fail_filename = (char *)std::__cxx11::string::c_str();
    __filename = (char *)std::__cxx11::string::c_str();
    register0x00000000 = fopen(__filename,"rb");
    if (register0x00000000 == (FILE *)0x0) {
      this_local._7_1_ = 0;
      buf[4] = '\x01';
      buf[5] = '\0';
      buf[6] = '\0';
      buf[7] = '\0';
    }
    else {
      this->has_timed_spikes = false;
      iVar7 = fseek(register0x00000000,3,0);
      if (iVar7 == 0) {
        sVar15 = fread(this->rid,1,4,stack0xffffffffffffff80);
        if (sVar15 == 4) {
          iVar7 = fseek(stack0xffffffffffffff80,0x1f,0);
          if (iVar7 == 0) {
            sVar15 = fread(&i,1,2,stack0xffffffffffffff80);
            if (sVar15 == 2) {
              uVar8 = PacketProcessor::Number((uchar)i,0xfe,0xfe,0xfe);
              this->pk = uVar8 == 3;
              EVar9 = PacketProcessor::Number(i._1_1_,0xfe,0xfe,0xfe);
              this->effect = EVar9;
              iVar7 = fseek(stack0xffffffffffffff80,0x25,0);
              if (iVar7 == 0) {
                sVar15 = fread(&i,1,2,stack0xffffffffffffff80);
                if (sVar15 == 2) {
                  uVar8 = PacketProcessor::Number((uchar)i,0xfe,0xfe,0xfe);
                  this->width = (char)uVar8 + '\x01';
                  uVar8 = PacketProcessor::Number(i._1_1_,0xfe,0xfe,0xfe);
                  this->height = (char)uVar8 + '\x01';
                  std::vector<Map_Tile,_std::allocator<Map_Tile>_>::resize
                            (&this->tiles,(ulong)((uint)this->height * (uint)this->width));
                  iVar7 = fseek(stack0xffffffffffffff80,0x2a,0);
                  if (iVar7 == 0) {
                    sVar15 = fread(&i,1,3,stack0xffffffffffffff80);
                    if (sVar15 == 3) {
                      uVar8 = PacketProcessor::Number((uchar)i,0xfe,0xfe,0xfe);
                      this->scroll = uVar8 != 0;
                      uVar8 = PacketProcessor::Number(i._1_1_,0xfe,0xfe,0xfe);
                      this->relog_x = (uchar)uVar8;
                      uVar8 = PacketProcessor::Number(i._2_1_,0xfe,0xfe,0xfe);
                      this->relog_y = (uchar)uVar8;
                      iVar7 = fseek(stack0xffffffffffffff80,0x2e,0);
                      if (iVar7 == 0) {
                        sVar15 = fread(&i,1,1,stack0xffffffffffffff80);
                        if (sVar15 == 1) {
                          uVar8 = PacketProcessor::Number((uchar)i,0xfe,0xfe,0xfe);
                          if (((byte)uVar8 == 0) ||
                             (iVar7 = fseek(stack0xffffffffffffff80,(ulong)(byte)uVar8 << 3,1),
                             iVar7 == 0)) {
                            sVar15 = fread(&i,1,1,stack0xffffffffffffff80);
                            if (sVar15 == 1) {
                              uVar8 = PacketProcessor::Number((uchar)i,0xfe,0xfe,0xfe);
                              if (((byte)uVar8 == 0) ||
                                 (iVar7 = fseek(stack0xffffffffffffff80,(ulong)(byte)uVar8 << 2,1),
                                 iVar7 == 0)) {
                                sVar15 = fread(&i,1,1,stack0xffffffffffffff80);
                                if (sVar15 == 1) {
                                  uVar8 = PacketProcessor::Number((uchar)i,0xfe,0xfe,0xfe);
                                  if (((char)uVar8 == '\0') ||
                                     (iVar7 = fseek(stack0xffffffffffffff80,
                                                    (ulong)((uVar8 & 0xff) * 0xc),1), iVar7 == 0)) {
                                    sVar15 = fread(&i,1,1,stack0xffffffffffffff80);
                                    if (sVar15 == 1) {
                                      uVar8 = PacketProcessor::Number((uchar)i,0xfe,0xfe,0xfe);
                                      for (ii = 0; ii < (int)(uVar8 & 0xff); ii = ii + 1) {
                                        sVar15 = fread(&i,1,2,stack0xffffffffffffff80);
                                        if (sVar15 != 2) {
                                          fclose(stack0xffffffffffffff80);
                                          map_safe_fail(0x204);
                                          this_local._7_1_ = 0;
                                          buf[4] = '\x01';
                                          buf[5] = '\0';
                                          buf[6] = '\0';
                                          buf[7] = '\0';
                                          goto LAB_001d649d;
                                        }
                                        uVar10 = PacketProcessor::Number((uchar)i,0xfe,0xfe,0xfe);
                                        bVar3 = (byte)uVar10;
                                        uVar10 = PacketProcessor::Number(i._1_1_,0xfe,0xfe,0xfe);
                                        for (local_a0 = 0; local_a0 < (int)(uVar10 & 0xff);
                                            local_a0 = local_a0 + 1) {
                                          sVar15 = fread(&i,1,2,stack0xffffffffffffff80);
                                          if (sVar15 != 2) {
                                            fclose(stack0xffffffffffffff80);
                                            map_safe_fail(0x209);
                                            this_local._7_1_ = 0;
                                            buf[4] = '\x01';
                                            buf[5] = '\0';
                                            buf[6] = '\0';
                                            buf[7] = '\0';
                                            goto LAB_001d649d;
                                          }
                                          uVar11 = PacketProcessor::Number((uchar)i,0xfe,0xfe,0xfe);
                                          chest._71_1_ = SUB41(uVar11,0);
                                          uVar11 = PacketProcessor::Number(i._1_1_,0xfe,0xfe,0xfe);
                                          chest._70_1_ = SUB41(uVar11,0);
                                          bVar4 = InBounds(this,chest._71_1_,bVar3);
                                          if (bVar4) {
                                            TVar12 = (TileSpec)(byte)chest._70_1_;
                                            pMVar16 = GetTile(this,chest._71_1_,bVar3);
                                            pMVar16->tilespec = TVar12;
                                            if (chest._70_1_ == '\t') {
                                              Map_Chest::Map_Chest((Map_Chest *)local_f0);
                                              pWVar2 = this->world;
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_110,"MaxChest",&local_111)
                                              ;
                                              pmVar14 = std::
                                                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                                  ::operator[](&(pWVar2->config).
                                                                                                                                
                                                  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                                  ,&local_110);
                                              chest.spawns.
                                              super__List_base<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>
                                              ._M_impl._M_node._M_size._4_4_ =
                                                   util::variant::operator_cast_to_int(pmVar14);
                                              std::__cxx11::string::~string((string *)&local_110);
                                              std::allocator<char>::~allocator(&local_111);
                                              pWVar2 = this->world;
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_138,"ChestSlots",
                                                         &local_139);
                                              pmVar14 = std::
                                                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                                  ::operator[](&(pWVar2->config).
                                                                                                                                
                                                  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                                  ,&local_138);
                                              chest.slots = util::variant::operator_cast_to_int
                                                                      (pmVar14);
                                              std::__cxx11::string::~string((string *)&local_138);
                                              std::allocator<char>::~allocator(&local_139);
                                              local_f0[0] = chest._71_1_;
                                              chest.spawns.
                                              super__List_base<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>
                                              ._M_impl._M_node._M_size._0_4_ = 0;
                                              local_f0[1] = bVar3;
                                              std::make_shared<Map_Chest,Map_Chest&>
                                                        ((Map_Chest *)local_150);
                                              std::
                                              vector<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>
                                              ::push_back(&this->chests,(value_type *)local_150);
                                              std::shared_ptr<Map_Chest>::~shared_ptr
                                                        ((shared_ptr<Map_Chest> *)local_150);
                                              Map_Chest::~Map_Chest((Map_Chest *)local_f0);
                                            }
                                            if (chest._70_1_ == '\"') {
                                              this->has_timed_spikes = true;
                                            }
                                          }
                                          else {
                                            Console::Wrn(
                                                  "Tile spec on map %i is outside of map bounds (%ix%i)"
                                                  ,(ulong)(uint)(int)this->id,
                                                  (ulong)(byte)chest._71_1_,(ulong)bVar3);
                                          }
                                        }
                                      }
                                      sVar15 = fread(&i,1,1,stack0xffffffffffffff80);
                                      if (sVar15 == 1) {
                                        uVar8 = PacketProcessor::Number((uchar)i,0xfe,0xfe,0xfe);
                                        for (ii_1 = 0; ii_1 < (int)(uVar8 & 0xff); ii_1 = ii_1 + 1)
                                        {
                                          sVar15 = fread(&i,1,2,stack0xffffffffffffff80);
                                          if (sVar15 != 2) {
                                            fclose(stack0xffffffffffffff80);
                                            map_safe_fail(0x22b);
                                            this_local._7_1_ = 0;
                                            buf[4] = '\x01';
                                            buf[5] = '\0';
                                            buf[6] = '\0';
                                            buf[7] = '\0';
                                            goto LAB_001d649d;
                                          }
                                          uVar10 = PacketProcessor::Number((uchar)i,0xfe,0xfe,0xfe);
                                          newwarp._15_1_ = SUB41(uVar10,0);
                                          uVar10 = PacketProcessor::Number(i._1_1_,0xfe,0xfe,0xfe);
                                          for (newwarp.spec = NoDoor;
                                              (int)newwarp.spec < (int)(uVar10 & 0xff);
                                              newwarp.spec = newwarp.spec + Door) {
                                            Map_Warp::Map_Warp((Map_Warp *)&index);
                                            sVar15 = fread(&i,1,8,stack0xffffffffffffff80);
                                            if (sVar15 != 8) {
                                              fclose(stack0xffffffffffffff80);
                                              map_safe_fail(0x231);
                                              this_local._7_1_ = 0;
                                              buf[4] = '\x01';
                                              buf[5] = '\0';
                                              buf[6] = '\0';
                                              buf[7] = '\0';
                                              goto LAB_001d649d;
                                            }
                                            uVar11 = PacketProcessor::Number
                                                               ((uchar)i,0xfe,0xfe,0xfe);
                                            i_2._3_1_ = (byte)uVar11;
                                            uVar11 = PacketProcessor::Number
                                                               (i._1_1_,i._2_1_,0xfe,0xfe);
                                            index._0_2_ = (undefined2)uVar11;
                                            uVar11 = PacketProcessor::Number(i._3_1_,0xfe,0xfe,0xfe)
                                            ;
                                            index._2_1_ = (undefined1)uVar11;
                                            uVar11 = PacketProcessor::Number
                                                               (local_8c,0xfe,0xfe,0xfe);
                                            index._3_1_ = (undefined1)uVar11;
                                            uVar11 = PacketProcessor::Number
                                                               (local_8b,0xfe,0xfe,0xfe);
                                            uStack_168 = (uchar)uVar11;
                                            newwarp._0_4_ =
                                                 PacketProcessor::Number
                                                           (innersize,outersize,0xfe,0xfe);
                                            bVar4 = InBounds(this,i_2._3_1_,newwarp._15_1_);
                                            if (bVar4) {
                                              pMVar16 = GetTile(this,i_2._3_1_,newwarp._15_1_);
                                              (pMVar16->warp).map = (undefined2)index;
                                              (pMVar16->warp).x = index._2_1_;
                                              (pMVar16->warp).y = index._3_1_;
                                              (pMVar16->warp).levelreq = (char)_uStack_168;
                                              *(int3 *)&(pMVar16->warp).field_0x5 =
                                                   SUB43(_uStack_168,1);
                                              (pMVar16->warp).spec = newwarp._0_4_;
                                              (pMVar16->warp).open = (bool)newwarp.levelreq;
                                            }
                                            else {
                                              Console::Wrn(
                                                  "Warp on map %i is outside of map bounds (%ix%i)",
                                                  (ulong)(uint)(int)this->id,(ulong)i_2._3_1_,
                                                  (ulong)(byte)newwarp._15_1_);
                                            }
                                          }
                                        }
                                        iVar7 = fseek(stack0xffffffffffffff80,0x2e,0);
                                        if (iVar7 == 0) {
                                          sVar15 = fread(&i,1,1,stack0xffffffffffffff80);
                                          if (sVar15 == 1) {
                                            uVar8 = PacketProcessor::Number((uchar)i,0xfe,0xfe,0xfe)
                                            ;
                                            _npc_id = 0;
                                            for (_spawntime = 0; _spawntime < (int)(uVar8 & 0xff);
                                                _spawntime = _spawntime + 1) {
                                              sVar15 = fread(&i,1,8,stack0xffffffffffffff80);
                                              if (sVar15 != 8) {
                                                fclose(stack0xffffffffffffff80);
                                                map_safe_fail(0x252);
                                                this_local._7_1_ = 0;
                                                buf[4] = '\x01';
                                                buf[5] = '\0';
                                                buf[6] = '\0';
                                                buf[7] = '\0';
                                                goto LAB_001d649d;
                                              }
                                              uVar10 = PacketProcessor::Number
                                                                 ((uchar)i,0xfe,0xfe,0xfe);
                                              amount = (uchar)uVar10;
                                              uVar10 = PacketProcessor::Number
                                                                 (i._1_1_,0xfe,0xfe,0xfe);
                                              local_17a = (byte)uVar10;
                                              uVar10 = PacketProcessor::Number
                                                                 (i._2_1_,i._3_1_,0xfe,0xfe);
                                              local_17c = (short)uVar10;
                                              uVar10 = PacketProcessor::Number
                                                                 (local_8c,0xfe,0xfe,0xfe);
                                              ii_2._3_1_ = (uchar)uVar10;
                                              uVar10 = PacketProcessor::Number
                                                                 (local_8b,innersize,0xfe,0xfe);
                                              ii_2._0_2_ = (short)uVar10;
                                              uVar10 = PacketProcessor::Number
                                                                 (outersize,0xfe,0xfe,0xfe);
                                              newnpc._7_1_ = (byte)uVar10;
                                              this_00 = ENF::Get(this->world->enf,(int)local_17c);
                                              bVar4 = ENF_Data_Base::operator_cast_to_bool
                                                                ((ENF_Data_Base *)this_00);
                                              if (!bVar4) {
                                                Console::Wrn(
                                                  "An NPC spawn on map %i uses a non-existent NPC (#%i at %ix%i)"
                                                  ,(ulong)(uint)(int)this->id,
                                                  (ulong)(uint)(int)local_17c,(ulong)amount,
                                                  (ulong)local_17a);
                                              }
                                              for (newnpc._0_4_ = 0;
                                                  (int)newnpc < (int)(uint)newnpc._7_1_;
                                                  newnpc._0_4_ = (int)newnpc + 1) {
                                                bVar4 = InBounds(this,amount,local_17a);
                                                if (bVar4) {
                                                  this_01 = (NPC *)operator_new(0x70);
                                                  index_00 = (uchar)_npc_id;
                                                  _npc_id = _npc_id + 1;
                                                  NPC::NPC(this_01,this,local_17c,amount,local_17a,
                                                           ii_2._3_1_,(short)ii_2,index_00,false);
                                                  _slot = this_01;
                                                  std::vector<NPC_*,_std::allocator<NPC_*>_>::
                                                  push_back(&this->npcs,(value_type *)&slot);
                                                  NPC::Spawn(_slot,(NPC *)0x0);
                                                }
                                                else {
                                                  sVar6 = this->id;
                                                  ENF::Get(this->world->enf,(int)local_17c);
                                                  uVar17 = std::__cxx11::string::c_str();
                                                  Console::Wrn(
                                                  "An NPC spawn on map %i is outside of map bounds (%s at %ix%i)"
                                                  ,(ulong)(uint)(int)sVar6,uVar17,(ulong)amount,
                                                  (ulong)local_17a);
                                                }
                                              }
                                            }
                                            sVar15 = fread(&i,1,1,stack0xffffffffffffff80);
                                            if (sVar15 == 1) {
                                              uVar8 = PacketProcessor::Number
                                                                ((uchar)i,0xfe,0xfe,0xfe);
                                              if (((byte)uVar8 == 0) ||
                                                 (iVar7 = fseek(stack0xffffffffffffff80,
                                                                (ulong)(byte)uVar8 << 2,1),
                                                 iVar7 == 0)) {
                                                sVar15 = fread(&i,1,1,stack0xffffffffffffff80);
                                                if (sVar15 == 1) {
                                                  uVar8 = PacketProcessor::Number
                                                                    ((uchar)i,0xfe,0xfe,0xfe);
                                                  for (_time = 0; _time < (int)(uVar8 & 0xff);
                                                      _time = _time + 1) {
                                                    sVar15 = fread(&i,1,0xc,stack0xffffffffffffff80)
                                                    ;
                                                    if (sVar15 != 0xc) {
                                                      fclose(stack0xffffffffffffff80);
                                                      map_safe_fail(0x279);
                                                      this_local._7_1_ = 0;
                                                      buf[4] = '\x01';
                                                      buf[5] = '\0';
                                                      buf[6] = '\0';
                                                      buf[7] = '\0';
                                                      goto LAB_001d649d;
                                                    }
                                                    uVar10 = PacketProcessor::Number
                                                                       ((uchar)i,0xfe,0xfe,0xfe);
                                                    bVar3 = (byte)uVar10;
                                                    uVar10 = PacketProcessor::Number
                                                                       (i._1_1_,0xfe,0xfe,0xfe);
                                                    bVar5 = (byte)uVar10;
                                                    uVar10 = PacketProcessor::Number
                                                                       (local_8c,0xfe,0xfe,0xfe);
                                                    uVar11 = PacketProcessor::Number
                                                                       (local_8b,innersize,0xfe,0xfe
                                                                       );
                                                    sVar6 = (short)uVar11;
                                                    uVar11 = PacketProcessor::Number
                                                                       (outersize,buf[0],0xfe,0xfe);
                                                    uVar13 = PacketProcessor::Number
                                                                       (buf[1],buf[2],buf[3],0xfe);
                                                    pEVar18 = EIF::Get(this->world->eif,(int)sVar6);
                                                    if ((int)sVar6 != pEVar18->id) {
                                                      Console::Wrn(
                                                  "A chest spawn on map %i uses a non-existent item (#%i at %ix%i)"
                                                  ,(ulong)(uint)(int)this->id,
                                                  (ulong)(uint)(int)sVar6,(ulong)bVar3,(ulong)bVar5)
                                                  ;
                                                  }
                                                  __end2 = std::
                                                  vector<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>
                                                  ::begin(&this->chests);
                                                  chest_1.
                                                  super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi =
                                                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                        *)std::
                                                  vector<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>
                                                  ::end(&this->chests);
                                                  while (bVar4 = __gnu_cxx::operator!=
                                                                           (&__end2,(
                                                  __normal_iterator<std::shared_ptr<Map_Chest>_*,_std::vector<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>_>
                                                  *)&chest_1.
                                                  super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount), bVar4) {
                                                    psVar19 = __gnu_cxx::
                                                                                                                            
                                                  __normal_iterator<std::shared_ptr<Map_Chest>_*,_std::vector<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>_>
                                                  ::operator*(&__end2);
                                                  std::shared_ptr<Map_Chest>::shared_ptr
                                                            ((shared_ptr<Map_Chest> *)
                                                             &spawn.last_taken,psVar19);
                                                  peVar20 = std::
                                                  __shared_ptr_access<Map_Chest,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<Map_Chest,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)&spawn.last_taken);
                                                  if ((peVar20->x == bVar3) &&
                                                     (peVar20 = std::
                                                  __shared_ptr_access<Map_Chest,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<Map_Chest,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)&spawn.last_taken), peVar20->y == bVar5)) {
                                                    spawn.item.amount = (short)uVar10 + 1;
                                                    spawn.item.slot._0_2_ = (short)uVar11;
                                                    spawn._16_8_ = Timer::GetTime();
                                                    local_1e8._4_2_ = sVar6;
                                                    spawn.spawnid = uVar13;
                                                    peVar20 = std::
                                                  __shared_ptr_access<Map_Chest,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<Map_Chest,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)&spawn.last_taken);
                                                  std::__cxx11::
                                                  list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>
                                                  ::push_back(&peVar20->spawns,
                                                              (value_type *)local_1e8);
                                                  peVar20 = std::
                                                  __shared_ptr_access<Map_Chest,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<Map_Chest,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)&spawn.last_taken);
                                                  local_1ec = (short)uVar10 + 1;
                                                  piVar21 = std::max<int>(&peVar20->slots,&local_1ec
                                                                         );
                                                  iVar7 = *piVar21;
                                                  peVar20 = std::
                                                  __shared_ptr_access<Map_Chest,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<Map_Chest,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)&spawn.last_taken);
                                                  peVar20->slots = iVar7;
                                                  buf[4] = '\x19';
                                                  buf[5] = '\0';
                                                  buf[6] = '\0';
                                                  buf[7] = '\0';
                                                  }
                                                  else {
                                                    buf[4] = '\0';
                                                    buf[5] = '\0';
                                                    buf[6] = '\0';
                                                    buf[7] = '\0';
                                                  }
                                                  std::shared_ptr<Map_Chest>::~shared_ptr
                                                            ((shared_ptr<Map_Chest> *)
                                                             &spawn.last_taken);
                                                  if (buf._4_4_ != 0) {
                                                    if (buf._4_4_ != 0x19) goto LAB_001d649d;
                                                    goto LAB_001d63f7;
                                                  }
                                                  __gnu_cxx::
                                                  __normal_iterator<std::shared_ptr<Map_Chest>_*,_std::vector<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>_>
                                                  ::operator++(&__end2);
                                                  }
                                                  sVar1 = this->id;
                                                  EIF::Get(this->world->eif,(int)sVar6);
                                                  uVar17 = std::__cxx11::string::c_str();
                                                  Console::Wrn(
                                                  "A chest spawn on map %i points to a non-chest (%s x%i at %ix%i)"
                                                  ,(ulong)(uint)(int)sVar1,uVar17,(ulong)uVar13,
                                                  (ulong)bVar3,(ulong)bVar5);
LAB_001d63f7:
                                                  }
                                                  iVar7 = fseek(stack0xffffffffffffff80,0,2);
                                                  if (iVar7 == 0) {
                                                    lVar22 = ftell(stack0xffffffffffffff80);
                                                    this->filesize = (int)lVar22;
                                                    fclose(stack0xffffffffffffff80);
                                                    this->exists = true;
                                                    this_local._7_1_ = 1;
                                                    buf[4] = '\x01';
                                                    buf[5] = '\0';
                                                    buf[6] = '\0';
                                                    buf[7] = '\0';
                                                  }
                                                  else {
                                                    fclose(stack0xffffffffffffff80);
                                                    map_safe_fail(0x29c);
                                                    this_local._7_1_ = 0;
                                                    buf[4] = '\x01';
                                                    buf[5] = '\0';
                                                    buf[6] = '\0';
                                                    buf[7] = '\0';
                                                  }
                                                }
                                                else {
                                                  fclose(stack0xffffffffffffff80);
                                                  map_safe_fail(0x275);
                                                  this_local._7_1_ = 0;
                                                  buf[4] = '\x01';
                                                  buf[5] = '\0';
                                                  buf[6] = '\0';
                                                  buf[7] = '\0';
                                                }
                                              }
                                              else {
                                                fclose(stack0xffffffffffffff80);
                                                map_safe_fail(0x272);
                                                this_local._7_1_ = 0;
                                                buf[4] = '\x01';
                                                buf[5] = '\0';
                                                buf[6] = '\0';
                                                buf[7] = '\0';
                                              }
                                            }
                                            else {
                                              fclose(stack0xffffffffffffff80);
                                              map_safe_fail(0x26e);
                                              this_local._7_1_ = 0;
                                              buf[4] = '\x01';
                                              buf[5] = '\0';
                                              buf[6] = '\0';
                                              buf[7] = '\0';
                                            }
                                          }
                                          else {
                                            fclose(stack0xffffffffffffff80);
                                            map_safe_fail(0x24d);
                                            this_local._7_1_ = 0;
                                            buf[4] = '\x01';
                                            buf[5] = '\0';
                                            buf[6] = '\0';
                                            buf[7] = '\0';
                                          }
                                        }
                                        else {
                                          fclose(stack0xffffffffffffff80);
                                          map_safe_fail(0x24c);
                                          this_local._7_1_ = 0;
                                          buf[4] = '\x01';
                                          buf[5] = '\0';
                                          buf[6] = '\0';
                                          buf[7] = '\0';
                                        }
                                      }
                                      else {
                                        fclose(stack0xffffffffffffff80);
                                        map_safe_fail(0x227);
                                        this_local._7_1_ = 0;
                                        buf[4] = '\x01';
                                        buf[5] = '\0';
                                        buf[6] = '\0';
                                        buf[7] = '\0';
                                      }
                                    }
                                    else {
                                      fclose(stack0xffffffffffffff80);
                                      map_safe_fail(0x200);
                                      this_local._7_1_ = 0;
                                      buf[4] = '\x01';
                                      buf[5] = '\0';
                                      buf[6] = '\0';
                                      buf[7] = '\0';
                                    }
                                  }
                                  else {
                                    fclose(stack0xffffffffffffff80);
                                    map_safe_fail(0x1fd);
                                    this_local._7_1_ = 0;
                                    buf[4] = '\x01';
                                    buf[5] = '\0';
                                    buf[6] = '\0';
                                    buf[7] = '\0';
                                  }
                                }
                                else {
                                  fclose(stack0xffffffffffffff80);
                                  map_safe_fail(0x1f9);
                                  this_local._7_1_ = 0;
                                  buf[4] = '\x01';
                                  buf[5] = '\0';
                                  buf[6] = '\0';
                                  buf[7] = '\0';
                                }
                              }
                              else {
                                fclose(stack0xffffffffffffff80);
                                map_safe_fail(0x1f6);
                                this_local._7_1_ = 0;
                                buf[4] = '\x01';
                                buf[5] = '\0';
                                buf[6] = '\0';
                                buf[7] = '\0';
                              }
                            }
                            else {
                              fclose(stack0xffffffffffffff80);
                              map_safe_fail(0x1f2);
                              this_local._7_1_ = 0;
                              buf[4] = '\x01';
                              buf[5] = '\0';
                              buf[6] = '\0';
                              buf[7] = '\0';
                            }
                          }
                          else {
                            fclose(stack0xffffffffffffff80);
                            map_safe_fail(0x1ef);
                            this_local._7_1_ = 0;
                            buf[4] = '\x01';
                            buf[5] = '\0';
                            buf[6] = '\0';
                            buf[7] = '\0';
                          }
                        }
                        else {
                          fclose(stack0xffffffffffffff80);
                          map_safe_fail(0x1eb);
                          this_local._7_1_ = 0;
                          buf[4] = '\x01';
                          buf[5] = '\0';
                          buf[6] = '\0';
                          buf[7] = '\0';
                        }
                      }
                      else {
                        fclose(stack0xffffffffffffff80);
                        map_safe_fail(0x1ea);
                        this_local._7_1_ = 0;
                        buf[4] = '\x01';
                        buf[5] = '\0';
                        buf[6] = '\0';
                        buf[7] = '\0';
                      }
                    }
                    else {
                      fclose(stack0xffffffffffffff80);
                      map_safe_fail(0x1e5);
                      this_local._7_1_ = 0;
                      buf[4] = '\x01';
                      buf[5] = '\0';
                      buf[6] = '\0';
                      buf[7] = '\0';
                    }
                  }
                  else {
                    fclose(stack0xffffffffffffff80);
                    map_safe_fail(0x1e4);
                    this_local._7_1_ = 0;
                    buf[4] = '\x01';
                    buf[5] = '\0';
                    buf[6] = '\0';
                    buf[7] = '\0';
                  }
                }
                else {
                  fclose(stack0xffffffffffffff80);
                  map_safe_fail(0x1de);
                  this_local._7_1_ = 0;
                  buf[4] = '\x01';
                  buf[5] = '\0';
                  buf[6] = '\0';
                  buf[7] = '\0';
                }
              }
              else {
                fclose(stack0xffffffffffffff80);
                map_safe_fail(0x1dd);
                this_local._7_1_ = 0;
                buf[4] = '\x01';
                buf[5] = '\0';
                buf[6] = '\0';
                buf[7] = '\0';
              }
            }
            else {
              fclose(stack0xffffffffffffff80);
              map_safe_fail(0x1d9);
              this_local._7_1_ = 0;
              buf[4] = '\x01';
              buf[5] = '\0';
              buf[6] = '\0';
              buf[7] = '\0';
            }
          }
          else {
            fclose(stack0xffffffffffffff80);
            map_safe_fail(0x1d8);
            this_local._7_1_ = 0;
            buf[4] = '\x01';
            buf[5] = '\0';
            buf[6] = '\0';
            buf[7] = '\0';
          }
        }
        else {
          fclose(stack0xffffffffffffff80);
          map_safe_fail(0x1d2);
          this_local._7_1_ = 0;
          buf[4] = '\x01';
          buf[5] = '\0';
          buf[6] = '\0';
          buf[7] = '\0';
        }
      }
      else {
        fclose(stack0xffffffffffffff80);
        map_safe_fail(0x1d1);
        this_local._7_1_ = 0;
        buf[4] = '\x01';
        buf[5] = '\0';
        buf[6] = '\0';
        buf[7] = '\0';
      }
    }
LAB_001d649d:
    std::__cxx11::string::~string((string *)local_40);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Map::Load()
{
	char namebuf[6];

	if (this->id < 0)
	{
		return false;
	}

	std::string filename = this->world->config["MapDir"];
	std::sprintf(namebuf, "%05i", this->id);
	filename.append(namebuf);
	filename.append(".emf");

	map_safe_fail_filename = filename.c_str();

	std::FILE *fh = std::fopen(filename.c_str(), "rb");

	if (!fh)
		return false;

	this->has_timed_spikes = false;

	SAFE_SEEK(fh, 0x03, SEEK_SET);
	SAFE_READ(this->rid, sizeof(char), 4, fh);

	char buf[12];
	unsigned char outersize;
	unsigned char innersize;

	SAFE_SEEK(fh, 0x1F, SEEK_SET);
	SAFE_READ(buf, sizeof(char), 2, fh);
	this->pk = PacketProcessor::Number(buf[0]) == 3;
	this->effect = static_cast<EffectType>(PacketProcessor::Number(buf[1]));

	SAFE_SEEK(fh, 0x25, SEEK_SET);
	SAFE_READ(buf, sizeof(char), 2, fh);
	this->width = PacketProcessor::Number(buf[0]) + 1;
	this->height = PacketProcessor::Number(buf[1]) + 1;

	this->tiles.resize(this->height * this->width);

	SAFE_SEEK(fh, 0x2A, SEEK_SET);
	SAFE_READ(buf, sizeof(char), 3, fh);
	this->scroll = PacketProcessor::Number(buf[0]);
	this->relog_x = PacketProcessor::Number(buf[1]);
	this->relog_y = PacketProcessor::Number(buf[2]);

	SAFE_SEEK(fh, 0x2E, SEEK_SET);
	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	if (outersize)
	{
		SAFE_SEEK(fh, 8 * outersize, SEEK_CUR);
	}

	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	if (outersize)
	{
		SAFE_SEEK(fh, 4 * outersize, SEEK_CUR);
	}

	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	if (outersize)
	{
		SAFE_SEEK(fh, 12 * outersize, SEEK_CUR);
	}

	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	for (int i = 0; i < outersize; ++i)
	{
		SAFE_READ(buf, sizeof(char), 2, fh);
		unsigned char yloc = PacketProcessor::Number(buf[0]);
		innersize = PacketProcessor::Number(buf[1]);
		for (int ii = 0; ii < innersize; ++ii)
		{
			SAFE_READ(buf, sizeof(char), 2, fh);
			unsigned char xloc = PacketProcessor::Number(buf[0]);
			unsigned char spec = PacketProcessor::Number(buf[1]);

			if (!this->InBounds(xloc, yloc))
			{
				Console::Wrn("Tile spec on map %i is outside of map bounds (%ix%i)", this->id, xloc, yloc);
				continue;
			}

			this->GetTile(xloc, yloc).tilespec = static_cast<Map_Tile::TileSpec>(spec);

			if (spec == Map_Tile::Chest)
			{
				Map_Chest chest;
				chest.maxchest = static_cast<int>(this->world->config["MaxChest"]);
				chest.chestslots = static_cast<int>(this->world->config["ChestSlots"]);
				chest.x = xloc;
				chest.y = yloc;
				chest.slots = 0;
				this->chests.push_back(std::make_shared<Map_Chest>(chest));
			}

			if (spec == Map_Tile::Spikes1)
			{
				this->has_timed_spikes = true;
			}
		}
	}

	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	for (int i = 0; i < outersize; ++i)
	{
		SAFE_READ(buf, sizeof(char), 2, fh);
		unsigned char yloc = PacketProcessor::Number(buf[0]);
		innersize = PacketProcessor::Number(buf[1]);
		for (int ii = 0; ii < innersize; ++ii)
		{
			Map_Warp newwarp;
			SAFE_READ(buf, sizeof(char), 8, fh);
			unsigned char xloc = PacketProcessor::Number(buf[0]);
			newwarp.map = PacketProcessor::Number(buf[1], buf[2]);
			newwarp.x = PacketProcessor::Number(buf[3]);
			newwarp.y = PacketProcessor::Number(buf[4]);
			newwarp.levelreq = PacketProcessor::Number(buf[5]);
			newwarp.spec = static_cast<Map_Warp::WarpSpec>(PacketProcessor::Number(buf[6], buf[7]));

			if (!this->InBounds(xloc, yloc))
			{
				Console::Wrn("Warp on map %i is outside of map bounds (%ix%i)", this->id, xloc, yloc);
				continue;
			}

			try
			{
				this->GetTile(xloc, yloc).warp = newwarp;
			}
			catch (...)
			{
				std::fclose(fh);
				map_safe_fail(__LINE__);
				return false;
			}
		}
	}

	SAFE_SEEK(fh, 0x2E, SEEK_SET);
	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	int index = 0;
	for (int i = 0; i < outersize; ++i)
	{
		SAFE_READ(buf, sizeof(char), 8, fh);
		unsigned char x = PacketProcessor::Number(buf[0]);
		unsigned char y = PacketProcessor::Number(buf[1]);
		short npc_id = PacketProcessor::Number(buf[2], buf[3]);
		unsigned char spawntype = PacketProcessor::Number(buf[4]);
		short spawntime = PacketProcessor::Number(buf[5], buf[6]);
		unsigned char amount = PacketProcessor::Number(buf[7]);

		if (!this->world->enf->Get(npc_id))
		{
			Console::Wrn("An NPC spawn on map %i uses a non-existent NPC (#%i at %ix%i)", this->id, npc_id, x, y);
		}

		for (int ii = 0; ii < amount; ++ii)
		{
			if (!this->InBounds(x, y))
			{
				Console::Wrn("An NPC spawn on map %i is outside of map bounds (%s at %ix%i)", this->id, this->world->enf->Get(npc_id).name.c_str(), x, y);
				continue;
			}

			NPC *newnpc = new NPC(this, npc_id, x, y, spawntype, spawntime, index++);
			this->npcs.push_back(newnpc);

			newnpc->Spawn();
		}
	}

	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	if (outersize)
	{
		SAFE_SEEK(fh, 4 * outersize, SEEK_CUR);
	}

	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	for (int i = 0; i < outersize; ++i)
	{
		SAFE_READ(buf, sizeof(char), 12, fh);
		unsigned char x = PacketProcessor::Number(buf[0]);
		unsigned char y = PacketProcessor::Number(buf[1]);
		short slot = PacketProcessor::Number(buf[4]);
		short itemid = PacketProcessor::Number(buf[5], buf[6]);
		short time = PacketProcessor::Number(buf[7], buf[8]);
		int amount = PacketProcessor::Number(buf[9], buf[10], buf[11]);

		if (itemid != this->world->eif->Get(itemid).id)
		{
			Console::Wrn("A chest spawn on map %i uses a non-existent item (#%i at %ix%i)", this->id, itemid, x, y);
		}

		UTIL_FOREACH(this->chests, chest)
		{
			if (chest->x == x && chest->y == y)
			{
				Map_Chest_Spawn spawn;

				spawn.slot = slot+1;
				spawn.time = time;
				spawn.last_taken = Timer::GetTime();
				spawn.item.id = itemid;
				spawn.item.amount = amount;

				chest->spawns.push_back(spawn);
				chest->slots = std::max(chest->slots, slot+1);
				goto skip_warning;
			}
		}
		Console::Wrn("A chest spawn on map %i points to a non-chest (%s x%i at %ix%i)", this->id, this->world->eif->Get(itemid).name.c_str(), amount, x, y);
		skip_warning:
		;
	}

	SAFE_SEEK(fh, 0x00, SEEK_END);
	this->filesize = std::ftell(fh);

	std::fclose(fh);

	this->exists = true;

	return true;
}